

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

int rsa_decrypt_wrap(void *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen,size_t osize,
                    _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = mbedtls_rsa_get_len((mbedtls_rsa_context *)ctx);
  if (sVar2 == ilen) {
    iVar1 = mbedtls_rsa_pkcs1_decrypt
                      ((mbedtls_rsa_context *)ctx,f_rng,p_rng,1,olen,input,output,osize);
  }
  else {
    iVar1 = -0x4080;
  }
  return iVar1;
}

Assistant:

static int rsa_decrypt_wrap( void *ctx,
                    const unsigned char *input, size_t ilen,
                    unsigned char *output, size_t *olen, size_t osize,
                    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    mbedtls_rsa_context * rsa = (mbedtls_rsa_context *) ctx;

    if( ilen != mbedtls_rsa_get_len( rsa ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    return( mbedtls_rsa_pkcs1_decrypt( rsa, f_rng, p_rng,
                MBEDTLS_RSA_PRIVATE, olen, input, output, osize ) );
}